

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODDXFilmEdgeReader.cpp
# Opt level: O1

Barcode * __thiscall
ZXing::OneD::DXFilmEdgeReader::decodePattern
          (Barcode *__return_storage_ptr__,DXFilmEdgeReader *this,int rowNumber,PatternView *next,
          unique_ptr<ZXing::OneD::RowReader::DecodingState,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
          *state)

{
  pointer *ppCVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  uchar uVar3;
  DXFEState *this_00;
  Iterator puVar4;
  pointer pCVar5;
  pointer pCVar6;
  double dVar7;
  undefined3 uVar8;
  bool bVar9;
  uint uVar10;
  DecodingState *pDVar11;
  Clock *pCVar12;
  pointer pCVar13;
  ushort *puVar14;
  pointer pCVar15;
  long *plVar16;
  undefined1 uVar17;
  Iterator puVar18;
  byte *pbVar19;
  size_type *psVar20;
  ushort uVar21;
  int iVar22;
  ulong uVar23;
  int iVar24;
  uint uVar25;
  Iterator puVar26;
  pointer pCVar27;
  int iVar28;
  PatternView *pPVar29;
  byte bVar30;
  PointI p;
  undefined8 uVar31;
  byte *pbVar32;
  long lVar33;
  unique_ptr<ZXing::OneD::RowReader::DecodingState,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
  *puVar34;
  ushort *puVar35;
  Iterator puVar36;
  ulong uVar37;
  ulong uVar38;
  float fVar39;
  pair<const_unsigned_short_*,_const_unsigned_short_*> pVar40;
  BitArray dataBits;
  string txt;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  string local_a8;
  string local_88;
  Error local_68;
  
  puVar34 = state;
  if ((state->_M_t).
      super___uniq_ptr_impl<ZXing::OneD::RowReader::DecodingState,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
      ._M_t.
      super__Tuple_impl<0UL,_ZXing::OneD::RowReader::DecodingState_*,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
      .super__Head_base<0UL,_ZXing::OneD::RowReader::DecodingState_*,_false>._M_head_impl ==
      (DecodingState *)0x0) {
    pDVar11 = (DecodingState *)operator_new(0x28);
    pDVar11->_vptr_DecodingState = (_func_int **)&PTR__DXFEState_001f9608;
    *(undefined4 *)&pDVar11[1]._vptr_DecodingState = 0;
    pDVar11[2]._vptr_DecodingState = (_func_int **)0x0;
    pDVar11[3]._vptr_DecodingState = (_func_int **)0x0;
    pDVar11[4]._vptr_DecodingState = (_func_int **)0x0;
    (state->_M_t).
    super___uniq_ptr_impl<ZXing::OneD::RowReader::DecodingState,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
    ._M_t.
    super__Tuple_impl<0UL,_ZXing::OneD::RowReader::DecodingState_*,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
    .super__Head_base<0UL,_ZXing::OneD::RowReader::DecodingState_*,_false>._M_head_impl = pDVar11;
    *(int *)&pDVar11[1]._vptr_DecodingState = rowNumber;
  }
  uVar17 = SUB81(puVar34,0);
  this_00 = (DXFEState *)
            (state->_M_t).
            super___uniq_ptr_impl<ZXing::OneD::RowReader::DecodingState,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
            ._M_t.
            super__Tuple_impl<0UL,_ZXing::OneD::RowReader::DecodingState_*,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
            .super__Head_base<0UL,_ZXing::OneD::RowReader::DecodingState_*,_false>._M_head_impl;
  if (((undefined1  [12])((undefined1  [12])*(this->super_RowReader)._opts & (undefined1  [12])0x2)
       == (undefined1  [12])0x0) && (rowNumber < this_00->centerRow)) goto LAB_00163336;
  if (next->_size < 10) {
LAB_00162dad:
    puVar36 = (Iterator)0x0;
    puVar26 = (Iterator)0x0;
    uVar10 = 0;
    puVar18 = (Iterator)0x0;
  }
  else {
    puVar18 = next->_data;
    puVar26 = next->_base;
    puVar36 = next->_end;
    if (puVar18 == puVar26 + 1) {
      txt._M_dataplus._M_p = *(pointer *)(puVar18 + 1);
      pVar40 = std::__minmax_element<unsigned_short_const*,__gnu_cxx::__ops::_Iter_less_iter>(&txt);
      uVar17 = SUB81(puVar34,0);
      uVar10 = 4;
      if ((int)((ulong)*pVar40.first * 0x155555558 >> 0x20) + 1U < (uint)*pVar40.second)
      goto LAB_00162d12;
    }
    else {
LAB_00162d12:
      uVar17 = SUB81(puVar34,0);
      puVar4 = next->_data;
      iVar24 = next->_size;
      if (puVar4 + (long)iVar24 + -10 <= puVar18) goto LAB_00162dad;
      do {
        uVar21 = puVar18[-1];
        txt._M_dataplus._M_p = *(pointer *)(puVar18 + 1);
        pVar40 = std::__minmax_element<unsigned_short_const*,__gnu_cxx::__ops::_Iter_less_iter>
                           (&txt);
        uVar17 = SUB81(puVar34,0);
        if ((*pVar40.first >> 1 < uVar21) &&
           ((uint)*pVar40.second <= (int)((ulong)*pVar40.first * 0x155555558 >> 0x20) + 1U)) {
          uVar10 = 4;
          goto LAB_00162db7;
        }
        if (puVar18 != (Iterator)0x0) {
          puVar18 = puVar18 + 2;
        }
      } while (puVar18 < puVar4 + (long)iVar24 + -10);
      puVar36 = (Iterator)0x0;
      puVar26 = (Iterator)0x0;
      uVar10 = 0;
      puVar18 = (Iterator)0x0;
    }
  }
LAB_00162db7:
  next->_data = puVar18;
  next->_size = uVar10;
  *(undefined4 *)&next->field_0xc = 0;
  next->_base = puVar26;
  next->_end = puVar36;
  if ((puVar18 < puVar26 || puVar18 == (Iterator)0x0) || puVar36 < puVar18 + uVar10)
  goto LAB_00163336;
  next->_size = 0x19;
  if (puVar36 < puVar18 + 0x19) {
LAB_00162e5d:
    iVar24 = (int)puVar26;
    puVar18 = next->_data;
    next->_size = 0x11;
    bVar9 = false;
    pPVar29 = next;
    if ((puVar18 != (Iterator)0x0) && (next->_base <= puVar18)) {
      if (next->_end < puVar18 + 0x11) goto LAB_00162f38;
      if (puVar18 == next->_base + 1) {
        uVar10 = 0x7fffffff;
      }
      else {
        uVar10 = (uint)puVar18[-1];
      }
      dVar7 = IsPattern<false,17,23>
                        (next,(FixedPattern<17,_23,_false> *)
                              (anonymous_namespace)::CLOCK_PATTERN_NO_FN,uVar10,2.0,0.0);
      puVar18 = (Iterator)0x0;
      bVar9 = false;
      if ((dVar7 != 0.0) || (NAN(dVar7))) goto LAB_00162edd;
    }
    bVar9 = false;
    uVar17 = SUB81(puVar18,0);
  }
  else {
    puVar26 = puVar26 + 1;
    if (puVar18 == puVar26) {
      uVar10 = 0x7fffffff;
    }
    else {
      uVar10 = (uint)puVar18[-1];
    }
    dVar7 = IsPattern<false,25,31>
                      (next,(FixedPattern<25,_31,_false> *)(anonymous_namespace)::CLOCK_PATTERN_FN,
                       uVar10,0.5,0.0);
    bVar9 = true;
    if ((dVar7 == 0.0) && (!NAN(dVar7))) goto LAB_00162e5d;
LAB_00162edd:
    uVar17 = bVar9;
    puVar18 = next->_data;
    puVar26 = next->_base;
    if (puVar26 == puVar18) {
      pPVar29 = (PatternView *)0x0;
    }
    else {
      uVar21 = 0;
      puVar36 = puVar26;
      do {
        uVar21 = uVar21 + *puVar36;
        puVar36 = puVar36 + 1;
      } while (puVar36 != puVar18);
      pPVar29 = (PatternView *)(ulong)uVar21;
    }
    bVar9 = true;
    if (puVar26 == puVar18 + next->_size) {
      iVar24 = -1;
    }
    else {
      uVar21 = 0;
      do {
        uVar21 = uVar21 + *puVar26;
        puVar26 = puVar26 + 1;
      } while (puVar26 != puVar18 + next->_size);
      iVar24 = uVar21 - 1;
    }
  }
LAB_00162f38:
  iVar28 = (int)pPVar29;
  if (bVar9) {
    pCVar12 = anon_unknown_0::DXFEState::findClock(this_00,iVar28,rowNumber);
    if (pCVar12 == (Clock *)0x0) {
      pCVar5 = *(pointer *)((long)&this_00->clocks + 8);
      if (pCVar5 == *(pointer *)((long)&this_00->clocks + 0x10)) {
        pCVar6 = (this_00->clocks).
                 super__Vector_base<ZXing::OneD::(anonymous_namespace)::Clock,_std::allocator<ZXing::OneD::(anonymous_namespace)::Clock>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((long)pCVar5 - (long)pCVar6 == 0x7ffffffffffffff0) {
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        uVar37 = (long)pCVar5 - (long)pCVar6 >> 4;
        uVar23 = 1;
        if (pCVar5 != pCVar6) {
          uVar23 = uVar37;
        }
        uVar38 = uVar23 + uVar37;
        if (0x7fffffffffffffe < uVar38) {
          uVar38 = 0x7ffffffffffffff;
        }
        if (CARRY8(uVar23,uVar37)) {
          uVar38 = 0x7ffffffffffffff;
        }
        if (uVar38 == 0) {
          pCVar13 = (pointer)0x0;
        }
        else {
          pCVar13 = (pointer)operator_new(uVar38 << 4);
        }
        pCVar13[uVar37].hasFrameNr = (bool)uVar17;
        pCVar13[uVar37].rowNumber = rowNumber;
        pCVar13[uVar37].xStart = iVar28;
        pCVar13[uVar37].xStop = iVar24;
        pCVar27 = pCVar13;
        for (pCVar15 = pCVar6; pCVar5 != pCVar15; pCVar15 = pCVar15 + 1) {
          uVar8 = *(undefined3 *)&pCVar15->field_0x1;
          iVar24 = pCVar15->rowNumber;
          iVar28 = pCVar15->xStart;
          iVar22 = pCVar15->xStop;
          pCVar27->hasFrameNr = pCVar15->hasFrameNr;
          *(undefined3 *)&pCVar27->field_0x1 = uVar8;
          pCVar27->rowNumber = iVar24;
          pCVar27->xStart = iVar28;
          pCVar27->xStop = iVar22;
          pCVar27 = pCVar27 + 1;
        }
        if (pCVar6 != (pointer)0x0) {
          operator_delete(pCVar6,(long)*(pointer *)((long)&this_00->clocks + 0x10) - (long)pCVar6);
        }
        (this_00->clocks).
        super__Vector_base<ZXing::OneD::(anonymous_namespace)::Clock,_std::allocator<ZXing::OneD::(anonymous_namespace)::Clock>_>
        ._M_impl.super__Vector_impl_data._M_start = pCVar13;
        *(pointer *)((long)&this_00->clocks + 8) = pCVar27 + 1;
        *(pointer *)((long)&this_00->clocks + 0x10) = pCVar13 + uVar38;
      }
      else {
        pCVar5->hasFrameNr = (bool)uVar17;
        pCVar5->rowNumber = rowNumber;
        pCVar5->xStart = iVar28;
        pCVar5->xStop = iVar24;
        ppCVar1 = (pointer *)((long)&this_00->clocks + 8);
        *ppCVar1 = *ppCVar1 + 1;
      }
    }
    else {
      pCVar12->hasFrameNr = (bool)uVar17;
      pCVar12->rowNumber = rowNumber;
      pCVar12->xStart = iVar28;
      pCVar12->xStop = iVar24;
    }
    if (next->_data != (Iterator)0x0) {
      next->_data = next->_data + next->_size;
    }
LAB_00163336:
    memset(__return_storage_ptr__,0,0xd8);
    Result::Result(__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  if ((this_00->clocks).
      super__Vector_base<ZXing::OneD::(anonymous_namespace)::Clock,_std::allocator<ZXing::OneD::(anonymous_namespace)::Clock>_>
      ._M_impl.super__Vector_impl_data._M_start == *(pointer *)((long)&this_00->clocks + 8))
  goto LAB_00163336;
  puVar18 = next->_data;
  next->_size = 5;
  if (((puVar18 == (Iterator)0x0) || (puVar18 < next->_base)) || (next->_end < puVar18 + 5))
  goto LAB_00163336;
  if (puVar18 == next->_base + 1) {
    uVar10 = 0x7fffffff;
  }
  else {
    uVar10 = (uint)puVar18[-1];
  }
  dVar7 = IsPattern<false,5,5>
                    (next,(FixedPattern<5,_5,_false> *)(anonymous_namespace)::DATA_START_PATTERN,
                     uVar10,0.5,0.0);
  if ((dVar7 == 0.0) && (!NAN(dVar7))) goto LAB_00163336;
  puVar18 = next->_data;
  puVar26 = next->_base;
  if (puVar26 == puVar18) {
    uVar10 = 0;
  }
  else {
    uVar21 = 0;
    do {
      uVar21 = uVar21 + *puVar26;
      puVar26 = puVar26 + 1;
    } while (puVar26 != puVar18);
    uVar10 = (uint)uVar21;
  }
  pCVar12 = anon_unknown_0::DXFEState::findClock(this_00,uVar10,rowNumber);
  if (pCVar12 == (Clock *)0x0) goto LAB_00163336;
  if (puVar18 != (Iterator)0x0) {
    next->_data = puVar18 + next->_size;
  }
  dataBits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  dataBits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  dataBits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar35 = next->_data;
  puVar14 = next->_base;
  bVar9 = puVar14 <= puVar35 && puVar35 != (ushort *)0x0;
  if (((puVar14 <= puVar35 && puVar35 != (ushort *)0x0) && (puVar35 + 1 <= next->_end)) &&
     (bVar30 = pCVar12->hasFrameNr, (uint)bVar30 * 8 != -0xf)) {
    do {
      fVar39 = 31.0;
      if ((bVar30 & 1) == 0) {
        fVar39 = 23.0;
      }
      uVar25 = (uint)((float)*puVar35 / ((float)(pCVar12->xStop - pCVar12->xStart) / fVar39) + 0.5);
      if (uVar25 != 0) {
        do {
          uVar25 = uVar25 - 1;
          txt._M_dataplus._M_p._0_1_ =
               ((uint)(((int)puVar35 - (int)puVar14) * 0x40000000 >> 0x1f) >> (uVar25 & 0x1f) & 1)
               != 0;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                    (&dataBits._bits,(uchar *)&txt);
        } while (uVar25 != 0);
      }
      if (next->_data != (Iterator)0x0) {
        next->_data = next->_data + 1;
      }
      puVar35 = next->_data;
      puVar14 = next->_base;
      bVar9 = puVar14 <= puVar35 && puVar35 != (ushort *)0x0;
      if ((puVar14 > puVar35 || puVar35 == (ushort *)0x0) || (next->_end < puVar35 + 1)) break;
      bVar30 = pCVar12->hasFrameNr;
    } while ((int)dataBits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
             (int)dataBits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start < (int)((uint)bVar30 * 8 + 0xf));
  }
  if ((uint)pCVar12->hasFrameNr * 8 + 0xf ==
      (int)dataBits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish -
      (int)dataBits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start) {
    next->_size = 3;
    puVar35 = puVar35 + 3;
    if ((bool)(bVar9 & puVar35 <= next->_end)) {
      if (puVar35 == next->_end + -1) {
        uVar25 = 0x7fffffff;
      }
      else {
        uVar25 = (uint)*puVar35;
      }
      dVar7 = IsPattern<false,3,3>
                        (next,(FixedPattern<3,_3,_false> *)&(anonymous_namespace)::DATA_STOP_PATTERN
                         ,uVar25,0.5,0.0);
      if ((dVar7 != 0.0) || (NAN(dVar7))) {
        uVar23 = (long)dataBits._bits.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)dataBits._bits.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
        if (uVar23 == 0) {
          uVar31 = 0;
LAB_00163880:
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar31);
        }
        if (*dataBits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start == '\0') {
          if (uVar23 < 9) {
            uVar31 = 8;
            goto LAB_00163880;
          }
          if (dataBits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start[8] == '\0') {
            if (pCVar12->hasFrameNr == true) {
              if (uVar23 < 0x15) {
                uVar31 = 0x14;
                goto LAB_00163880;
              }
              if (dataBits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start[0x14] != '\0') goto LAB_001633b8;
              if (uVar23 < 0x17) {
                uVar31 = 0x16;
                goto LAB_00163880;
              }
              uVar3 = dataBits._bits.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start[0x16];
            }
            else {
              if (uVar23 < 0xf) {
                uVar31 = 0xe;
                goto LAB_00163880;
              }
              uVar3 = dataBits._bits.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start[0xe];
            }
            if (uVar3 == '\0') {
              pbVar19 = dataBits._bits.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish + -2;
              if (dataBits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start == pbVar19) {
                bVar30 = 0;
              }
              else {
                bVar30 = 0;
                pbVar32 = dataBits._bits.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start;
                do {
                  bVar30 = bVar30 + *pbVar32;
                  pbVar32 = pbVar32 + 1;
                } while (pbVar32 != pbVar19);
                bVar30 = bVar30 & 1;
              }
              if (bVar30 == *pbVar19) {
                iVar24 = (int)uVar23;
                if (iVar24 < 1) {
                  iVar28 = 0;
                }
                else {
                  iVar22 = 7;
                  if (iVar24 < 7) {
                    iVar22 = iVar24;
                  }
                  lVar33 = 0;
                  iVar28 = 0;
                  do {
                    iVar28 = (uint)(dataBits._bits.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start[lVar33 + 1] != '\0') +
                             iVar28 * 2;
                    lVar33 = lVar33 + 1;
                  } while (iVar22 != (int)lVar33);
                }
                if (iVar28 == 0) {
                  memset(__return_storage_ptr__,0,0xd8);
                  Result::Result(__return_storage_ptr__);
                }
                else {
                  if (iVar24 < 1) {
                    iVar24 = 0;
                  }
                  else {
                    iVar22 = 4;
                    if (iVar24 < 4) {
                      iVar22 = iVar24;
                    }
                    lVar33 = 0;
                    iVar24 = 0;
                    do {
                      iVar24 = (uint)(dataBits._bits.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start[lVar33 + 9] != '\0')
                               + iVar24 * 2;
                      lVar33 = lVar33 + 1;
                    } while (iVar22 != (int)lVar33);
                  }
                  txt._M_dataplus._M_p = (pointer)&txt.field_2;
                  txt._M_string_length = 0;
                  txt.field_2._M_local_buf[0] = '\0';
                  std::__cxx11::string::reserve((ulong)&txt);
                  std::__cxx11::to_string(&local_88,iVar28);
                  plVar16 = (long *)std::__cxx11::string::append((char *)&local_88);
                  paVar2 = &local_e8.field_2;
                  psVar20 = (size_type *)(plVar16 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar16 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)psVar20) {
                    local_e8.field_2._M_allocated_capacity = *psVar20;
                    local_e8.field_2._8_8_ = plVar16[3];
                    local_e8._M_dataplus._M_p = (pointer)paVar2;
                  }
                  else {
                    local_e8.field_2._M_allocated_capacity = *psVar20;
                    local_e8._M_dataplus._M_p = (pointer)*plVar16;
                  }
                  local_e8._M_string_length = plVar16[1];
                  *plVar16 = (long)psVar20;
                  plVar16[1] = 0;
                  *(undefined1 *)(plVar16 + 2) = 0;
                  std::__cxx11::to_string(&local_a8,iVar24);
                  std::operator+(&local_c8,&local_e8,&local_a8);
                  std::__cxx11::string::operator=((string *)&txt,(string *)&local_c8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
                    operator_delete(local_c8._M_dataplus._M_p,
                                    local_c8.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
                    operator_delete(local_a8._M_dataplus._M_p,
                                    local_a8.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_e8._M_dataplus._M_p != paVar2) {
                    operator_delete(local_e8._M_dataplus._M_p,
                                    local_e8.field_2._M_allocated_capacity + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_88._M_dataplus._M_p != &local_88.field_2) {
                    operator_delete(local_88._M_dataplus._M_p,
                                    local_88.field_2._M_allocated_capacity + 1);
                  }
                  if (pCVar12->hasFrameNr == true) {
                    iVar24 = (int)dataBits._bits.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                             (int)dataBits._bits.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start;
                    if (iVar24 < 1) {
                      iVar24 = 0;
                    }
                    else {
                      iVar28 = 6;
                      if (iVar24 < 6) {
                        iVar28 = iVar24;
                      }
                      lVar33 = 0;
                      iVar24 = 0;
                      do {
                        iVar24 = (uint)(dataBits._bits.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start[lVar33 + 0xd] !=
                                       '\0') + iVar24 * 2;
                        lVar33 = lVar33 + 1;
                      } while (iVar28 != (int)lVar33);
                    }
                    std::__cxx11::to_string(&local_e8,iVar24);
                    std::operator+(&local_c8,"/",&local_e8);
                    std::__cxx11::string::_M_append((char *)&txt,(ulong)local_c8._M_dataplus._M_p);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
                      operator_delete(local_c8._M_dataplus._M_p,
                                      local_c8.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_e8._M_dataplus._M_p != paVar2) {
                      operator_delete(local_e8._M_dataplus._M_p,
                                      local_e8.field_2._M_allocated_capacity + 1);
                    }
                    if ((ulong)((long)dataBits._bits.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)dataBits._bits.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start) < 0x14) {
                      std::__throw_out_of_range_fmt
                                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                 ,0x13);
                    }
                    if (dataBits._bits.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start[0x13] != '\0') {
                      std::__cxx11::string::append((char *)&txt);
                    }
                  }
                  puVar18 = next->_base;
                  if (puVar18 == next->_data + next->_size) {
                    iVar24 = -1;
                  }
                  else {
                    uVar21 = 0;
                    do {
                      uVar21 = uVar21 + *puVar18;
                      puVar18 = puVar18 + 1;
                    } while (puVar18 != next->_data + next->_size);
                    iVar24 = uVar21 - 1;
                  }
                  p.y = rowNumber;
                  p.x = iVar24;
                  bVar9 = anon_unknown_0::Clock::isCloseTo(pCVar12,p,pCVar12->xStop);
                  if (bVar9) {
                    pCVar12->xStart = uVar10;
                    pCVar12->xStop = iVar24;
                    paVar2 = &local_68._msg.field_2;
                    local_68._msg.field_2._8_8_ = 0;
                    local_68._msg._M_string_length = 0;
                    local_68._msg.field_2._M_allocated_capacity = 0;
                    local_68._file = (char *)0x0;
                    local_68._line = -1;
                    local_68._type = None;
                    local_68._43_5_ = 0;
                    local_68._msg._M_dataplus._M_p = (pointer)paVar2;
                    Result::Result(__return_storage_ptr__,&txt,rowNumber,uVar10,iVar24,DXFilmEdge,
                                   (SymbologyIdentifier)0x0,&local_68,false);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_68._msg._M_dataplus._M_p != paVar2) {
                      operator_delete(local_68._msg._M_dataplus._M_p,
                                      local_68._msg.field_2._M_allocated_capacity + 1);
                    }
                  }
                  else {
                    memset(__return_storage_ptr__,0,0xd8);
                    Result::Result(__return_storage_ptr__);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)txt._M_dataplus._M_p != &txt.field_2) {
                    operator_delete(txt._M_dataplus._M_p,
                                    CONCAT71(txt.field_2._M_allocated_capacity._1_7_,
                                             txt.field_2._M_local_buf[0]) + 1);
                  }
                }
              }
              else {
                memset(__return_storage_ptr__,0,0xd8);
                Result::Result(__return_storage_ptr__);
              }
              goto LAB_001633cf;
            }
          }
        }
      }
    }
  }
LAB_001633b8:
  memset(__return_storage_ptr__,0,0xd8);
  Result::Result(__return_storage_ptr__);
LAB_001633cf:
  if (dataBits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(dataBits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)dataBits._bits.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)dataBits._bits.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
    return __return_storage_ptr__;
  }
  return __return_storage_ptr__;
}

Assistant:

Barcode DXFilmEdgeReader::decodePattern(int rowNumber, PatternView& next, std::unique_ptr<DecodingState>& state) const
{
	if (!state) {
		state.reset(new DXFEState);
		static_cast<DXFEState*>(state.get())->centerRow = rowNumber;
	}

	auto dxState = static_cast<DXFEState*>(state.get());

	// Only consider rows below the center row of the image
	if (!_opts.tryRotate() && rowNumber < dxState->centerRow)
		return {};

	// Look for a pattern that is part of both the clock as well as the data track (ommitting the first bar)
	constexpr auto Is4x1 = [](const PatternView& view, int spaceInPixel) {
		// find min/max of 4 consecutive bars/spaces and make sure they are close together
		auto [m, M] = std::minmax({view[1], view[2], view[3], view[4]});
		return M <= m * 4 / 3 + 1 && spaceInPixel > m / 2;
	};

	// 12 is the minimum size of the data track (at least one product class bit + one parity bit)
	next = FindLeftGuard<4>(next, 10, Is4x1);
	if (!next.isValid())
		return {};

	// Check if the 4x1 pattern is part of a clock track
	if (auto clock = CheckForClock(rowNumber, next)) {
		dxState->addClock(*clock);
		next.skipSymbol();
		return {};
	}

	// Without at least one clock track, we stop here
	if (dxState->clocks.empty())
		return {};

	constexpr float minDataQuietZone = 0.5;

	if (!IsPattern(next, DATA_START_PATTERN, minDataQuietZone))
		return {};

	auto xStart = next.pixelsInFront();

	// Only consider data tracks that are next to a clock track
	auto clock = dxState->findClock(xStart, rowNumber);
	if (!clock)
		return {};

	// Skip the data start pattern (black, white, black, white, black)
	// The first signal bar is always white: this is the
	// separation between the start pattern and the product number
	next.skipSymbol();

	// Read the data bits
	BitArray dataBits;
	while (next.isValid(1) && dataBits.size() < clock->dataLength()) {

		int modules = int(next[0] / clock->moduleSize() + 0.5);
		// even index means we are at a bar, otherwise at a space
		dataBits.appendBits(next.index() % 2 == 0 ? 0xFFFFFFFF : 0x0, modules);

		next.shift(1);
	}

	// Check the data track length
	if (dataBits.size() != clock->dataLength())
		return {};

	next = next.subView(0, DATA_STOP_PATTERN.size());

	// Check there is the Stop pattern at the end of the data track
	if (!next.isValid() || !IsRightGuard(next, DATA_STOP_PATTERN, minDataQuietZone))
		return {};

	// The following bits are always white (=false), they are separators.
	if (dataBits.get(0) || dataBits.get(8) || (clock->hasFrameNr ? (dataBits.get(20) || dataBits.get(22)) : dataBits.get(14)))
		return {};

	// Check the parity bit
	auto signalSum = Reduce(dataBits.begin(), dataBits.end() - 2, 0);
	auto parityBit = *(dataBits.end() - 2);
	if (signalSum % 2 != (int)parityBit)
		return {};

	// Compute the DX 1 number (product number)
	auto productNumber = ToInt(dataBits, 1, 7);
	if (!productNumber)
		return {};

	// Compute the DX 2 number (generation number)
	auto generationNumber = ToInt(dataBits, 9, 4);

	// Generate the textual representation.
	// Eg: 115-10/11A means: DX1 = 115, DX2 = 10, Frame number = 11A
	std::string txt;
	txt.reserve(10);
	txt = std::to_string(productNumber) + "-" + std::to_string(generationNumber);
	if (clock->hasFrameNr) {
		auto frameNr = ToInt(dataBits, 13, 6);
		txt += "/" + std::to_string(frameNr);
		if (dataBits.get(19))
			txt += "A";
	}

	auto xStop = next.pixelsTillEnd();

	// The found data track must end near the clock track
	if (!clock->isCloseToStop(xStop, rowNumber))
		return {};

	// Update the clock coordinates with the latest corresponding data track
	// This may improve signal detection for next row iterations
	clock->xStart = xStart;
	clock->xStop = xStop;

	return Barcode(txt, rowNumber, xStart, xStop, BarcodeFormat::DXFilmEdge, {});
}